

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Instr * __thiscall
GlobOpt::ToVar(GlobOpt *this,Instr *instr,RegOpnd *regOpnd,BasicBlock *block,Value *value,
              bool needsUpdate)

{
  StackSym *this_00;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  BasicBlock *pBVar1;
  code *pcVar2;
  BasicBlock *this_02;
  bool bVar3;
  BOOLEAN BVar4;
  OpndKind OVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar6;
  undefined8 extraout_RAX;
  ValueInfo *this_03;
  IntConstOpnd *this_04;
  GlobOptBlockData *pGVar7;
  JITTimeFunctionBody *this_05;
  FunctionJITTimeInfo *this_06;
  SymOpnd *this_07;
  PropertySymOpnd *this_08;
  char *pcVar8;
  undefined7 uVar10;
  Func *func;
  Func **ppFVar9;
  Instr *pIVar11;
  long lVar12;
  OpCode opcode;
  undefined7 in_register_00000089;
  GlobOpt *this_09;
  int local_78;
  undefined4 local_74;
  int32 intConstantValue;
  BasicBlock *local_68;
  Value *local_60;
  StackSym *local_58;
  Instr *local_50;
  RegOpnd *local_48;
  undefined8 local_40;
  GlobOptBlockData *local_38;
  
  local_74 = (undefined4)CONCAT71(in_register_00000089,needsUpdate);
  this_00 = regOpnd->m_sym;
  pcVar8 = (char *)block;
  local_48 = regOpnd;
  bVar3 = IsTypeSpecPhaseOff(this->func);
  if (!bVar3) {
    if (this->prePassLoop != (Loop *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::Set
                ((block->globOptData).liveVarSyms,(this_00->super_Sym).m_id);
      return instr;
    }
    _intConstantValue = this;
    BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((block->globOptData).liveVarSyms,(this_00->super_Sym).m_id);
    if (BVar4 != '\0') {
      return instr;
    }
    if (this_00->m_type != TyVar) {
      if ((this_00->field_0x1a & 1) == 0) {
        return instr;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2c73,"(!varSym->IsTypeSpec())","!varSym->IsTypeSpec()");
      if (bVar3) {
        *puVar6 = 0;
        return instr;
      }
LAB_00443d93:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    local_38 = &block->globOptData;
    bVar3 = GlobOptBlockData::IsTypeSpecialized(local_38,&this_00->super_Sym);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      pcVar8 = "block->globOptData.IsTypeSpecialized(varSym)";
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2c78,"(block->globOptData.IsTypeSpecialized(varSym))",
                         "block->globOptData.IsTypeSpecialized(varSym)");
      if (!bVar3) goto LAB_00443d93;
      *puVar6 = 0;
    }
    this_09 = _intConstantValue;
    if (value == (Value *)0x0) {
      value = GlobOptBlockData::FindValue(local_38,&this_00->super_Sym);
    }
    if (value == (Value *)0x0) {
      this_03 = (ValueInfo *)0x0;
    }
    else {
      this_03 = value->valueInfo;
    }
    local_60 = value;
    if ((this_03 != (ValueInfo *)0x0) &&
       (bVar3 = ValueType::IsInt(&this_03->super_ValueType), bVar3)) {
      BVSparse<Memory::JitArenaAllocator>::Clear
                ((block->globOptData).liveLossyInt32Syms,(this_00->super_Sym).m_id);
    }
    BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((block->globOptData).liveInt32Syms,(this_00->super_Sym).m_id);
    local_50 = instr;
    if ((BVar4 == '\0') ||
       (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((block->globOptData).liveLossyInt32Syms,(this_00->super_Sym).m_id),
       BVar4 != '\0')) {
      BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((block->globOptData).liveFloat64Syms,(this_00->super_Sym).m_id);
      if (BVar4 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2cb6,"((0))","UNREACHED");
        if (!bVar3) goto LAB_00443d93;
        *puVar6 = 0;
        local_58 = (StackSym *)0x0;
        local_40 = 0;
        local_38 = (GlobOptBlockData *)0x0;
      }
      else {
        local_58 = StackSym::GetFloat64EquivSym(this_00,this_09->func);
        local_58->field_0x1a = local_58->field_0x1a | 2;
        if (this_03 == (ValueInfo *)0x0) {
          local_40 = 0;
          local_60 = NewGenericValue(this_09,(ValueType)0x108,(Opnd *)0x0);
          this_03 = local_60->valueInfo;
          GlobOptBlockData::SetValue(local_38,local_60,&this_00->super_Sym);
          IR::Opnd::SetValueType
                    (&local_48->super_Opnd,
                     (ValueType)
                     *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                      &(this_03->super_ValueType).field_0.field_0);
          local_38 = (GlobOptBlockData *)CONCAT71((int7)((ulong)extraout_RAX >> 8),10);
        }
        else {
          bVar3 = ValueType::IsNumber(&this_03->super_ValueType);
          local_38 = (GlobOptBlockData *)CONCAT71((int7)((ulong)pcVar8 >> 8),10);
          if (bVar3) {
            local_40 = 0;
          }
          else {
            this_03 = ValueInfo::SpecializeToFloat64(this_03,this_09->alloc);
            local_40 = 0;
            ChangeValueInfo(this_09,block,local_60,this_03,false,false);
            IR::Opnd::SetValueType
                      (&local_48->super_Opnd,
                       (ValueType)
                       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(this_03->super_ValueType).field_0.field_0);
          }
        }
      }
    }
    else {
      local_58 = StackSym::GetInt32EquivSym(this_00,this_09->func);
      if (this_03 == (ValueInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_38 = (GlobOptBlockData *)__tls_get_addr(&PTR_0155fe48);
        *(undefined4 *)&local_38->symToValueMap = 1;
        pcVar8 = "valueInfo";
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2c90,"(valueInfo)","valueInfo");
        if (!bVar3) goto LAB_00443d93;
        *(undefined4 *)&local_38->symToValueMap = 0;
      }
      bVar3 = ValueType::IsInt(&this_03->super_ValueType);
      uVar10 = (undefined7)((ulong)pcVar8 >> 8);
      local_38 = (GlobOptBlockData *)CONCAT71(uVar10,3);
      local_40 = CONCAT71(uVar10,1);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_68 = (BasicBlock *)__tls_get_addr(&PTR_0155fe48);
        *(undefined4 *)&local_68->next = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2c91,"(valueInfo->IsInt())","valueInfo->IsInt()");
        if (!bVar3) goto LAB_00443d93;
        *(undefined4 *)&local_68->next = 0;
      }
    }
    if (this_03 == (ValueInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2cb9,"(valueInfo)","valueInfo");
      if (!bVar3) goto LAB_00443d93;
      *puVar6 = 0;
    }
    local_68 = block;
    bVar3 = ValueInfo::TryGetIntConstantValue(this_03,&local_78,false);
    pIVar11 = local_50;
    if (bVar3) {
      this_04 = IR::IntConstOpnd::New((long)local_78,TyInt32,local_50->m_func,false);
      func = pIVar11->m_func;
      opcode = LdC_A_I4;
    }
    else {
      this_04 = (IntConstOpnd *)IR::RegOpnd::New(local_58,(IRType)local_38,local_50->m_func);
      IR::Opnd::SetIsJITOptimizedReg((Opnd *)this_04,true);
      func = pIVar11->m_func;
      opcode = ToVar;
    }
    pGVar7 = (GlobOptBlockData *)
             IR::Instr::New(opcode,&local_48->super_Opnd,&this_04->super_Opnd,func);
    IR::Instr::SetByteCodeOffset((Instr *)pGVar7,pIVar11);
    this_01 = pGVar7->liveLossyInt32Syms;
    local_38 = pGVar7;
    OVar5 = IR::Opnd::GetKind((Opnd *)this_01);
    this_02 = local_68;
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_00443d93;
      *puVar6 = 0;
      this_09 = _intConstantValue;
    }
    IR::Opnd::SetIsJITOptimizedReg((Opnd *)this_01,true);
    if ((char)local_40 == '\0') {
      valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)
                  *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                   &(this_03->super_ValueType).field_0.field_0;
    }
    else {
      valueType.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetTaggedInt();
    }
    pGVar7 = local_38;
    IR::Opnd::SetValueType((Opnd *)local_38->liveLossyInt32Syms,(ValueType)valueType.field_0);
    IR::Opnd::SetValueType((Opnd *)pGVar7->liveFloat64Syms,(ValueType)valueType.field_0);
    pBVar1 = this_02->next;
    ppFVar9 = (Func **)&pBVar1->firstInstr;
    if (pBVar1 == (BasicBlock *)0x0) {
      ppFVar9 = &this_02->func;
    }
    lVar12 = 0x18;
    if (pBVar1 == (BasicBlock *)0x0) {
      lVar12 = 0xd0;
    }
    pIVar11 = local_50->m_prev;
    if ((*(Instr **)((long)&(*ppFVar9)->m_alloc + lVar12) == local_50) &&
       ((local_50->m_kind == InstrKindBranch || (local_50->m_opcode == BailTarget)))) {
      for (; pIVar11->m_opcode == ByteCodeUses; pIVar11 = pIVar11->m_prev) {
      }
    }
    BasicBlock::InsertInstrAfter(this_02,(Instr *)pGVar7,pIVar11);
    BVSparse<Memory::JitArenaAllocator>::Set
              ((this_02->globOptData).liveVarSyms,(this_00->super_Sym).m_id);
    this_05 = JITTimeWorkItem::GetJITFunctionBody(this_09->func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_05);
    this_06 = JITTimeWorkItem::GetJITTimeInfo(this_09->func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_06);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,sourceContextId,functionId);
    if (bVar3) {
      Output::Print(L"TRACE ");
      if (this_09->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this_09->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this_09->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      IR::Opnd::Dump(&local_48->super_Opnd);
      Output::Print(L" : ");
      Output::Print(L"Converting to var\n");
      Output::Flush();
    }
    instr = local_50;
    if (this_02->loop != (Loop *)0x0) {
      if (this_09->prePassLoop != (Loop *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2cef,"(!this->IsLoopPrePass())","!this->IsLoopPrePass()");
        if (!bVar3) goto LAB_00443d93;
        *puVar6 = 0;
        pGVar7 = local_38;
      }
      TryHoistInvariant(this_09,(Instr *)pGVar7,this_02,local_60,local_60,(Value *)0x0,false,false,
                        false,BailOutInvalid);
    }
    if ((char)local_74 != '\0') {
      ProcessKills(this_09,(Instr *)pGVar7);
      ValueNumberObjectType(this_09,(Opnd *)pGVar7->liveLossyInt32Syms,(Instr *)pGVar7);
      if ((instr->m_src1 != (Opnd *)0x0) &&
         (OVar5 = IR::Opnd::GetKind(instr->m_src1), OVar5 == OpndKindSym)) {
        this_07 = IR::Opnd::AsSymOpnd(instr->m_src1);
        bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_07);
        if (bVar3) {
          this_08 = IR::Opnd::AsPropertySymOpnd(instr->m_src1);
          bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_08);
          if (bVar3) {
            IR::PropertySymOpnd::SetTypeChecked(this_08,false);
            IR::PropertySymOpnd::SetTypeAvailable(this_08,false);
            IR::PropertySymOpnd::SetWriteGuardChecked(this_08,false);
          }
          FinishOptPropOp(this_09,instr,this_08,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
          instr = SetTypeCheckBailOut(this_09,instr->m_src1,instr,(BailOutInfo *)0x0);
        }
      }
    }
  }
  return instr;
}

Assistant:

IR::Instr *
GlobOpt::ToVar(IR::Instr *instr, IR::RegOpnd *regOpnd, BasicBlock *block, Value *value, bool needsUpdate)
{
    IR::Instr *newInstr;
    StackSym *varSym = regOpnd->m_sym;

    if (IsTypeSpecPhaseOff(this->func))
    {
        return instr;
    }

    if (this->IsLoopPrePass())
    {
        block->globOptData.liveVarSyms->Set(varSym->m_id);
        return instr;
    }

    if (block->globOptData.liveVarSyms->Test(varSym->m_id))
    {
        // Already live, nothing to do
        return instr;
    }

    if (!varSym->IsVar())
    {
        Assert(!varSym->IsTypeSpec());
        // Leave non-vars alone.
        return instr;
    }

    Assert(block->globOptData.IsTypeSpecialized(varSym));

    if (!value)
    {
        value = block->globOptData.FindValue(varSym);
    }

    ValueInfo *valueInfo = value ? value->GetValueInfo() : nullptr;
    if(valueInfo && valueInfo->IsInt())
    {
        // If two syms have the same value, one is lossy-int-specialized, and then the other is int-specialized, the value
        // would have been updated to definitely int. Upon using the lossy-int-specialized sym later, it would be flagged as
        // lossy while the value is definitely int. Since the bit-vectors are based on the sym and not the value, update the
        // lossy state.
        block->globOptData.liveLossyInt32Syms->Clear(varSym->m_id);
    }

    IRType fromType = TyIllegal;
    StackSym *typeSpecSym = nullptr;

    if (block->globOptData.liveInt32Syms->Test(varSym->m_id) && !block->globOptData.liveLossyInt32Syms->Test(varSym->m_id))
    {
        fromType = TyInt32;
        typeSpecSym = varSym->GetInt32EquivSym(this->func);
        Assert(valueInfo);
        Assert(valueInfo->IsInt());
    }
    else if (block->globOptData.liveFloat64Syms->Test(varSym->m_id))
    {

        fromType = TyFloat64;
        typeSpecSym = varSym->GetFloat64EquivSym(this->func);

        // Ensure that all bailout FromVars that generate a value for this type-specialized sym will bail out on any non-number
        // value, even ones that have already been generated before. Float-specialized non-number values cannot be converted
        // back to Var since they will not go back to the original non-number value. The dead-store pass will update the bailout
        // kind on already-generated FromVars based on this bit.
        typeSpecSym->m_requiresBailOnNotNumber = true;

        // A previous float conversion may have used BailOutPrimitiveButString, which does not change the value type to say
        // definitely float, since it can also be a non-string primitive. The convert back to Var though, will cause that
        // bailout kind to be changed to BailOutNumberOnly in the dead-store phase, so from the point of the initial conversion
        // to float, that the value is definitely number. Since we don't know where the FromVar is, change the value type here.
        if(valueInfo)
        {
            if(!valueInfo->IsNumber())
            {
                valueInfo = valueInfo->SpecializeToFloat64(alloc);
                ChangeValueInfo(block, value, valueInfo);
                regOpnd->SetValueType(valueInfo->Type());
            }
        }
        else
        {
            value = NewGenericValue(ValueType::Float);
            valueInfo = value->GetValueInfo();
            block->globOptData.SetValue(value, varSym);
            regOpnd->SetValueType(valueInfo->Type());
        }
    }
    else
    {
        Assert(UNREACHED);
    }

    AssertOrFailFast(valueInfo);

    int32 intConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        // Lower will tag or create a number directly
        newInstr = IR::Instr::New(Js::OpCode::LdC_A_I4, regOpnd,
            IR::IntConstOpnd::New(intConstantValue, TyInt32, instr->m_func), instr->m_func);
    }
    else
    {
        IR::RegOpnd * regNew = IR::RegOpnd::New(typeSpecSym, fromType, instr->m_func);
        Js::OpCode opcode = Js::OpCode::ToVar;
        regNew->SetIsJITOptimizedReg(true);

        newInstr = IR::Instr::New(opcode, regOpnd, regNew, instr->m_func);
    }
    newInstr->SetByteCodeOffset(instr);
    newInstr->GetDst()->AsRegOpnd()->SetIsJITOptimizedReg(true);

    ValueType valueType = valueInfo->Type();
    if(fromType == TyInt32)
    {
    #if !INT32VAR // All 32-bit ints are taggable on 64-bit architectures
        IntConstantBounds constantBounds;
        AssertVerify(valueInfo->TryGetIntConstantBounds(&constantBounds));
        if(constantBounds.IsTaggable())
    #endif
        {
            // The value is within the taggable range, so set the opnd value types to TaggedInt to avoid the overflow check
            valueType = ValueType::GetTaggedInt();
        }
    }
    newInstr->GetDst()->SetValueType(valueType);
    newInstr->GetSrc1()->SetValueType(valueType);

    IR::Instr *insertAfterInstr = instr->m_prev;
    if (instr == block->GetLastInstr() &&
        (instr->IsBranchInstr() || instr->m_opcode == Js::OpCode::BailTarget))
    {
        // Don't insert code between the branch and the preceding ByteCodeUses instrs...
        while(insertAfterInstr->m_opcode == Js::OpCode::ByteCodeUses)
        {
            insertAfterInstr = insertAfterInstr->m_prev;
        }
    }
    block->InsertInstrAfter(newInstr, insertAfterInstr);

    block->globOptData.liveVarSyms->Set(varSym->m_id);

    GOPT_TRACE_OPND(regOpnd, _u("Converting to var\n"));

    if (block->loop)
    {
        Assert(!this->IsLoopPrePass());
        this->TryHoistInvariant(newInstr, block, value, value, nullptr, false);
    }

    if (needsUpdate)
    {
        // Make sure that the kill effect of the ToVar instruction is tracked and that the kill of a property
        // type is reflected in the current instruction.
        this->ProcessKills(newInstr);
        this->ValueNumberObjectType(newInstr->GetDst(), newInstr);

        if (instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
        {
            // Reprocess the load source. We need to reset the PropertySymOpnd fields first.
            IR::PropertySymOpnd *propertySymOpnd = instr->GetSrc1()->AsPropertySymOpnd();
            if (propertySymOpnd->IsTypeCheckSeqCandidate())
            {
                propertySymOpnd->SetTypeChecked(false);
                propertySymOpnd->SetTypeAvailable(false);
                propertySymOpnd->SetWriteGuardChecked(false);
            }

            this->FinishOptPropOp(instr, propertySymOpnd);
            instr = this->SetTypeCheckBailOut(instr->GetSrc1(), instr, nullptr);
        }
    }

    return instr;
}